

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  long lVar7;
  char cVar8;
  uint uVar9;
  buffer_appender<char> bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  buffer<char> *buf;
  uint uVar14;
  uint uVar15;
  _Alloc_hider _Var16;
  _Alloc_hider _Var17;
  char *pcVar18;
  int iVar19;
  size_type sVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  string groups;
  char digits [40];
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *local_288;
  char *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar8 != '\0') {
      uVar11 = this->abs_value;
      lVar7 = 0x3f;
      if ((uVar11 | 1) != 0) {
        for (; (uVar11 | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (uint)((int)lVar7 * 2));
      uVar22 = (uint)uVar4 -
               (uint)(uVar11 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                                         (ulong)uVar4 * 8));
      iVar23 = -(uint)(uVar11 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                                          (ulong)uVar4 * 8));
      pcVar18 = local_2a8._M_dataplus._M_p + local_2a8._M_string_length;
      _Var16._M_p = local_2a8._M_dataplus._M_p;
      uVar15 = uVar22;
      uVar9 = uVar22;
      if (local_2a8._M_string_length != 0) {
        _Var17._M_p = local_2a8._M_dataplus._M_p;
        sVar20 = local_2a8._M_string_length;
        uVar14 = uVar22;
        do {
          cVar2 = *_Var17._M_p;
          uVar21 = uVar9 - (int)cVar2;
          _Var16._M_p = _Var17._M_p;
          uVar15 = uVar14;
          if ((uVar21 == 0 || (int)uVar9 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar14 = uVar14 + 1;
          _Var17._M_p = _Var17._M_p + 1;
          sVar20 = sVar20 - 1;
          _Var16._M_p = pcVar18;
          uVar15 = (int)local_2a8._M_string_length + iVar23 + (uint)uVar4;
          uVar9 = uVar21;
        } while (sVar20 != 0);
      }
      if (_Var16._M_p == pcVar18) {
        uVar15 = uVar15 + (int)(uVar9 - 1) / (int)pcVar18[-1];
      }
      pcVar18 = local_278 + (int)uVar22;
      uVar12 = uVar11;
      if (99 < uVar11) {
        do {
          uVar12 = uVar11 / 100;
          *(undefined2 *)(pcVar18 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar11 % 100) * 2);
          pcVar18 = pcVar18 + -2;
          bVar6 = 9999 < uVar11;
          uVar11 = uVar12;
        } while (bVar6);
      }
      if (uVar12 < 10) {
        pcVar18[-1] = (byte)uVar12 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar18 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar12 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_007fca68;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar15 = uVar15 + this->prefix_size;
      if (-1 < (int)uVar15) {
        uVar11 = (ulong)uVar15;
        if (500 < uVar15) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar11);
        }
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar11 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar11;
        }
        pcVar18 = local_248.super_buffer<char>.ptr_ + (uVar11 - 1);
        if (1 < (int)uVar22) {
          uVar12 = (ulong)uVar22;
          iVar19 = iVar23 + (uint)uVar4 + 1;
          iVar23 = 0;
          _Var16._M_p = local_2a8._M_dataplus._M_p;
          do {
            uVar12 = uVar12 - 1;
            pcVar1 = pcVar18 + -1;
            *pcVar18 = local_278[uVar12 & 0xffffffff];
            cVar2 = *_Var16._M_p;
            if (0 < cVar2) {
              iVar23 = iVar23 + 1;
              if ((cVar2 != '\x7f') && (iVar23 % (int)cVar2 == 0)) {
                if (_Var16._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
                  iVar23 = 0;
                  _Var16._M_p = _Var16._M_p + 1;
                }
                pcVar18[-1] = cVar8;
                pcVar1 = pcVar18 + -2;
              }
            }
            pcVar18 = pcVar1;
            iVar19 = iVar19 + -1;
          } while (2 < iVar19);
        }
        *pcVar18 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar18[-1] = '-';
        }
        pbVar5 = this->specs;
        uVar12 = (ulong)pbVar5->width;
        if (-1 < (long)uVar12) {
          local_280 = local_248.super_buffer<char>.ptr_;
          uVar13 = 0;
          if (uVar11 <= uVar12) {
            uVar13 = uVar12 - uVar11;
          }
          bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          local_288 = this;
          if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar11 + (pbVar5->fill).size_ * uVar13) {
            (*(code *)**(undefined8 **)
                        bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar12 = uVar13 >> (bVar3 & 0x3f);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar12,&pbVar5->fill);
          bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (local_280,local_280 + uVar11,bVar10);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar10,uVar13 - uVar12,&pbVar5->fill);
          (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_004e7ca1;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_004e7ca1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }